

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckd_alloc.c
# Opt level: O0

void ckd_free_3d(void *inptr)

{
  void ***ptr;
  void *inptr_local;
  
  if ((inptr != (void *)0x0) && (*inptr != 0)) {
    ckd_free((void *)**inptr);
  }
  if (inptr != (void *)0x0) {
    ckd_free(*inptr);
  }
  ckd_free(inptr);
  return;
}

Assistant:

void
ckd_free_3d(void *inptr)
{
    void ***ptr = (void ***)inptr;

    if (ptr && ptr[0])
        ckd_free(ptr[0][0]);
    if (ptr)
        ckd_free(ptr[0]);
    ckd_free(ptr);
}